

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_butterfly_8(float *x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = (float)*(undefined8 *)x;
  fVar2 = (float)((ulong)*(undefined8 *)x >> 0x20);
  fVar5 = (float)*(undefined8 *)(x + 4);
  fVar6 = (float)((ulong)*(undefined8 *)(x + 4) >> 0x20);
  fVar9 = fVar5 - fVar1;
  fVar10 = fVar6 - fVar2;
  fVar7 = (float)*(undefined8 *)(x + 6);
  fVar8 = (float)((ulong)*(undefined8 *)(x + 6) >> 0x20);
  fVar3 = (float)*(undefined8 *)(x + 2);
  fVar11 = fVar7 - fVar3;
  fVar4 = (float)((ulong)*(undefined8 *)(x + 2) >> 0x20);
  fVar12 = fVar8 - fVar4;
  *x = fVar11 + fVar10;
  x[1] = fVar12 - fVar9;
  x[2] = fVar11 - fVar10;
  x[3] = fVar12 + fVar9;
  fVar5 = fVar5 + fVar1;
  fVar6 = fVar6 + fVar2;
  fVar7 = fVar7 + fVar3;
  fVar8 = fVar8 + fVar4;
  x[4] = fVar7 - fVar5;
  x[5] = fVar8 - fVar6;
  x[6] = fVar7 + fVar5;
  x[7] = fVar8 + fVar6;
  return;
}

Assistant:

STIN void mdct_butterfly_8(DATA_TYPE *x){
  REG_TYPE r0   = x[6] + x[2];
  REG_TYPE r1   = x[6] - x[2];
  REG_TYPE r2   = x[4] + x[0];
  REG_TYPE r3   = x[4] - x[0];

           x[6] = r0   + r2;
           x[4] = r0   - r2;

           r0   = x[5] - x[1];
           r2   = x[7] - x[3];
           x[0] = r1   + r0;
           x[2] = r1   - r0;

           r0   = x[5] + x[1];
           r1   = x[7] + x[3];
           x[3] = r2   + r3;
           x[1] = r2   - r3;
           x[7] = r1   + r0;
           x[5] = r1   - r0;

}